

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_osc.c
# Opt level: O0

t_int * noise_perform(t_int *w)

{
  uint *puVar1;
  uint local_28;
  int local_24;
  int val;
  int n;
  int *vp;
  t_sample *out;
  t_int *w_local;
  
  puVar1 = (uint *)w[2];
  local_28 = *puVar1;
  local_24 = (int)w[3];
  vp = (int *)w[1];
  while (local_24 != 0) {
    *vp = (int)((float)(int)((local_28 & 0x7fffffff) + 0xc0000000) * 9.313226e-10);
    local_28 = local_28 * 0x19fb4787 + 0x16d1b86b;
    local_24 = local_24 + -1;
    vp = vp + 1;
  }
  *puVar1 = local_28;
  return w + 4;
}

Assistant:

static t_int *noise_perform(t_int *w)
{
    t_sample *out = (t_sample *)(w[1]);
    int *vp = (int *)(w[2]);
    int n = (int)(w[3]);
    int val = *vp;
    while (n--)
    {
        *out++ = ((t_sample)((val & 0x7fffffff) - 0x40000000)) *
            (t_sample)(1.0 / 0x40000000);
        val = val * 435898247 + 382842987;
    }
    *vp = val;
    return (w+4);
}